

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O1

int mecab_do(int argc,char **argv)

{
  char cVar1;
  istream *piVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ModelImpl *this;
  _Alloc_hider __s;
  size_t sVar8;
  ostream *poVar9;
  undefined4 extraout_var;
  long *plVar11;
  char *pcVar12;
  undefined4 extraout_var_00;
  int *piVar13;
  char *pcVar14;
  int __oflag;
  uint uVar15;
  ostream_wrapper ofs;
  istream_wrapper ifs;
  string sentence;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rest;
  string ofilename;
  Param param;
  ostream_wrapper local_300;
  long *local_2f0;
  istream_wrapper local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  ulong local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  Param local_278;
  undefined8 *puVar10;
  
  MeCab::Param::Param(&local_278);
  iVar4 = MeCab::Param::open(&local_278,argc,(int)argv,MeCab::(anonymous_namespace)::long_options);
  if ((char)iVar4 == '\0') {
    pcVar12 = MeCab::whatlog::str(&local_278.what_);
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x17b2c8);
    }
    else {
      sVar8 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar12,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    iVar4 = 1;
    std::ostream::flush();
    goto LAB_0011fe0f;
  }
  bVar3 = MeCab::Param::get<bool>(&local_278,"help");
  __s._M_p = local_278.help_._M_dataplus._M_p;
  if ((!bVar3) &&
     (bVar3 = MeCab::Param::get<bool>(&local_278,"version"),
     __s._M_p = local_278.version_._M_dataplus._M_p, !bVar3)) {
    bVar3 = MeCab::load_dictionary_resource(&local_278);
    if (bVar3) {
      iVar4 = MeCab::Param::get<int>(&local_278,"lattice-level");
      if (0 < iVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"lattice-level is DEPERCATED. ",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"use --marginal or --nbest.",0x1a);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x68);
        std::ostream::put(-0x68);
        std::ostream::flush();
      }
      this = (ModelImpl *)operator_new(0x30);
      MeCab::anon_unknown_0::ModelImpl::ModelImpl(this);
      iVar4 = MeCab::anon_unknown_0::ModelImpl::open(this,(char *)&local_278,__oflag);
      if ((char)iVar4 != '\0') {
        MeCab::Param::get<std::__cxx11::string>(&local_298,&local_278,"output");
        if (local_298._M_string_length == 0) {
          std::__cxx11::string::operator=((string *)&local_298,"-");
        }
        uVar5 = MeCab::Param::get<int>(&local_278,"nbest");
        if (0xfffffdff < uVar5 - 0x201) {
          MeCab::ostream_wrapper::ostream_wrapper(&local_300,local_298._M_dataplus._M_p);
          if (((byte)local_300.os_[*(long *)(*(long *)local_300.os_ + -0x18) + 0x20] & 5) == 0) {
            bVar3 = MeCab::Param::get<bool>(&local_278,"dump-config");
            if (bVar3) {
              iVar4 = 1;
              MeCab::Param::dump_config(&local_278,local_300.os_);
            }
            else {
              bVar3 = MeCab::Param::get<bool>(&local_278,"dictionary-info");
              if (!bVar3) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_2b8,&local_278.rest_);
                if (local_2b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    local_2b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"-","");
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_2b8,&local_2d8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                    operator_delete(local_2d8._M_dataplus._M_p);
                  }
                }
                uVar7 = MeCab::Param::get<int>(&local_278,"input-buffer-size");
                bVar3 = MeCab::Param::get<bool>(&local_278,"partial");
                uVar15 = 0x2000;
                if (0x2000 < (int)uVar7) {
                  uVar15 = uVar7;
                }
                if (0x4fffff < (int)uVar15) {
                  uVar15 = 0x500000;
                }
                uVar7 = uVar15 << 3;
                if (!bVar3) {
                  uVar7 = uVar15;
                }
                pcVar12 = (char *)operator_new__((ulong)uVar7);
                iVar4 = (*(this->super_Model)._vptr_Model[3])(this);
                plVar11 = (long *)CONCAT44(extraout_var_00,iVar4);
                local_2f0 = plVar11;
                if (plVar11 == (long *)0x0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"cannot create tagger",0x14);
                  iVar4 = 1;
                  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                }
                else {
                  if (local_2b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      local_2b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
                    MeCab::istream_wrapper::istream_wrapper
                              (&local_2e8,
                               ((local_2b8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
                    if (((byte)local_2e8.is_[*(long *)(*(long *)local_2e8.is_ + -0x18) + 0x20] & 5)
                        == 0) {
                      local_2a0 = (ulong)uVar5;
                      do {
                        if (bVar3) {
                          local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
                          local_2d8._M_string_length = 0;
                          local_2d8.field_2._M_local_buf[0] = '\0';
                          piVar13 = (int *)operator_new__(0x2000);
                          while( true ) {
                            piVar2 = local_2e8.is_;
                            std::ios::widen((char)*(undefined8 *)(*(long *)local_2e8.is_ + -0x18) +
                                            (char)local_2e8.is_);
                            plVar11 = (long *)std::istream::getline
                                                        ((char *)piVar2,(long)piVar13,'\0');
                            if ((*(byte *)((long)plVar11 + *(long *)(*plVar11 + -0x18) + 0x20) & 5)
                                != 0) break;
                            std::__cxx11::string::append((char *)&local_2d8);
                            std::__cxx11::string::push_back((char)&local_2d8);
                            if ((*piVar13 == 0x534f45) || ((char)*piVar13 == '\0'))
                            goto LAB_00120496;
                          }
                          std::ios::clear((int)local_2e8.is_ +
                                          (int)*(undefined8 *)(*(long *)local_2e8.is_ + -0x18));
LAB_00120496:
                          strncpy(pcVar12,local_2d8._M_dataplus._M_p,(ulong)uVar7);
                          operator_delete__(piVar13);
                          plVar11 = local_2f0;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                            operator_delete(local_2d8._M_dataplus._M_p);
                            plVar11 = local_2f0;
                          }
                        }
                        else {
                          std::istream::getline((char *)local_2e8.is_,(long)pcVar12);
                        }
                        if (((*(uint *)(local_2e8.is_ +
                                       *(long *)(*(long *)local_2e8.is_ + -0x18) + 0x20) & 2) != 0)
                           && (*pcVar12 == '\0')) {
                          iVar4 = 0;
                          goto LAB_001205cd;
                        }
                        if ((*(uint *)(local_2e8.is_ +
                                      *(long *)(*(long *)local_2e8.is_ + -0x18) + 0x20) & 5) != 0) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,"input-buffer overflow. ",0x17);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,"The line is split. use -b #SIZE option."
                                     ,0x27);
                          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                          std::ios::clear((int)local_2e8.is_ +
                                          (int)*(undefined8 *)(*(long *)local_2e8.is_ + -0x18));
                        }
                        if ((int)uVar5 < 2) {
                          pcVar14 = (char *)(**(code **)(*plVar11 + 8))(plVar11,pcVar12);
                        }
                        else {
                          pcVar14 = (char *)(**(code **)(*plVar11 + 0x18))
                                                      (plVar11,local_2a0,pcVar12);
                        }
                        poVar9 = local_300.os_;
                        if (pcVar14 == (char *)0x0) goto LAB_00120591;
                        sVar8 = strlen(pcVar14);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar14,sVar8);
                        std::ostream::flush();
                        plVar11 = local_2f0;
                      } while( true );
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"no such file or directory: ",0x1b);
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,
                                        ((local_2b8.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p,(local_2b8.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_string_length);
                    iVar4 = 1;
                    std::endl<char,std::char_traits<char>>(poVar9);
                    goto LAB_001205cd;
                  }
                  iVar4 = 0;
                }
                goto LAB_001205fc;
              }
              iVar6 = (**(this->super_Model)._vptr_Model)(this);
              iVar4 = 1;
              poVar9 = local_300.os_;
              for (puVar10 = (undefined8 *)CONCAT44(extraout_var,iVar6); local_300.os_ = poVar9,
                  puVar10 != (undefined8 *)0x0; puVar10 = (undefined8 *)puVar10[5]) {
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"filename:\t",10);
                pcVar12 = (char *)*puVar10;
                if (pcVar12 == (char *)0x0) {
                  std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
                }
                else {
                  sVar8 = strlen(pcVar12);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar12,sVar8);
                }
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                poVar9 = local_300.os_;
                std::__ostream_insert<char,std::char_traits<char>>(local_300.os_,"version:\t",9);
                poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                poVar9 = local_300.os_;
                std::__ostream_insert<char,std::char_traits<char>>(local_300.os_,"charset:\t",9);
                pcVar12 = (char *)puVar10[1];
                if (pcVar12 == (char *)0x0) {
                  std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
                }
                else {
                  sVar8 = strlen(pcVar12);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar12,sVar8);
                }
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                poVar9 = local_300.os_;
                std::__ostream_insert<char,std::char_traits<char>>(local_300.os_,"type:\t",6);
                plVar11 = (long *)std::ostream::operator<<
                                            ((ostream *)poVar9,*(int *)((long)puVar10 + 0x14));
                std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
                std::ostream::put((char)plVar11);
                std::ostream::flush();
                poVar9 = local_300.os_;
                std::__ostream_insert<char,std::char_traits<char>>(local_300.os_,"size:\t",6);
                poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                poVar9 = local_300.os_;
                std::__ostream_insert<char,std::char_traits<char>>(local_300.os_,"left size:\t",0xb)
                ;
                poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                poVar9 = local_300.os_;
                std::__ostream_insert<char,std::char_traits<char>>
                          (local_300.os_,"right size:\t",0xc);
                poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                cVar1 = (char)local_300.os_;
                std::ios::widen((char)*(undefined8 *)(*(long *)local_300.os_ + -0x18) + cVar1);
                std::ostream::put(cVar1);
                std::ostream::flush();
                poVar9 = local_300.os_;
              }
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"no such file or directory: ",0x1b);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_298._M_dataplus._M_p,
                                local_298._M_string_length);
            iVar4 = 1;
            std::endl<char,std::char_traits<char>>(poVar9);
          }
          goto LAB_00120621;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"invalid N value",0xf);
        iVar4 = 1;
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        goto LAB_00120650;
      }
      pcVar12 = getGlobalError();
      if (pcVar12 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x17b2c8);
      }
      else {
        sVar8 = strlen(pcVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar12,sVar8);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
      std::ostream::put(-0x38);
      iVar4 = 1;
      std::ostream::flush();
      goto LAB_00120666;
    }
    __s._M_p = MeCab::whatlog::str(&local_278.what_);
  }
  if (__s._M_p == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x17b2c8);
  }
  else {
    sVar8 = strlen(__s._M_p);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s._M_p,sVar8);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  iVar4 = 0;
  std::ostream::flush();
  goto LAB_0011fe0f;
LAB_00120591:
  pcVar14 = (char *)(**(code **)(*local_2f0 + 0xd8))();
  poVar9 = std::operator<<((ostream *)&std::cout,pcVar14);
  std::endl<char,std::char_traits<char>>(poVar9);
  iVar4 = 1;
  plVar11 = local_2f0;
LAB_001205cd:
  local_2e8._vptr_istream_wrapper = (_func_int **)&PTR__istream_wrapper_00172ba8;
  if (local_2e8.is_ != (istream *)0x0 && local_2e8.is_ != (istream *)&std::cin) {
    (**(code **)(*(long *)local_2e8.is_ + 8))();
  }
LAB_001205fc:
  if (plVar11 != (long *)0x0) {
    (**(code **)(*plVar11 + 0xe8))(plVar11);
  }
  operator_delete__(pcVar12);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b8);
LAB_00120621:
  local_300._vptr_ostream_wrapper = (_func_int **)&PTR__ostream_wrapper_00172b78;
  if (local_300.os_ != (ostream *)0x0 && local_300.os_ != (ostream *)&std::cout) {
    (**(code **)(*(long *)local_300.os_ + 8))();
  }
LAB_00120650:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
LAB_00120666:
  (*(this->super_Model)._vptr_Model[7])(this);
LAB_0011fe0f:
  MeCab::Param::~Param(&local_278);
  return iVar4;
}

Assistant:

int mecab_do(int argc, char **argv) {
#define WHAT_ERROR(msg) do {                    \
    std::cout << msg << std::endl;              \
    return EXIT_FAILURE; }                      \
  while (0);

  MeCab::Param param;
  if (!param.open(argc, argv, MeCab::long_options)) {
    std::cout << param.what() << std::endl;
    return EXIT_FAILURE;
  }

  if (param.get<bool>("help")) {
    std::cout << param.help() << std::endl;
    return EXIT_SUCCESS;
  }

  if (param.get<bool>("version")) {
    std::cout << param.version() << std::endl;
    return EXIT_SUCCESS;
  }

  if (!load_dictionary_resource(&param)) {
    std::cout << param.what() << std::endl;
    return EXIT_SUCCESS;
  }

  if (param.get<int>("lattice-level") >= 1) {
    std::cerr << "lattice-level is DEPERCATED. "
              << "use --marginal or --nbest." << std::endl;
  }

  MeCab::scoped_ptr<MeCab::ModelImpl> model(new MeCab::ModelImpl);
  if (!model->open(param)) {
    std::cout << MeCab::getLastError() << std::endl;
    return EXIT_FAILURE;
  }

  std::string ofilename = param.get<std::string>("output");
  if (ofilename.empty()) {
    ofilename = "-";
  }

  const int nbest = param.get<int>("nbest");
  if (nbest <= 0 || nbest > NBEST_MAX) {
    WHAT_ERROR("invalid N value");
  }

  MeCab::ostream_wrapper ofs(ofilename.c_str());
  if (!*ofs) {
    WHAT_ERROR("no such file or directory: " << ofilename);
  }

  if (param.get<bool>("dump-config")) {
    param.dump_config(&*ofs);
    return EXIT_FAILURE;
  }

  if (param.get<bool>("dictionary-info")) {
    for (const MeCab::DictionaryInfo *d = model->dictionary_info();
         d; d = d->next) {
      *ofs << "filename:\t" << d->filename << std::endl;
      *ofs << "version:\t" << d->version << std::endl;
      *ofs << "charset:\t" << d->charset << std::endl;
      *ofs << "type:\t" << d->type   << std::endl;
      *ofs << "size:\t" << d->size << std::endl;
      *ofs << "left size:\t" << d->lsize << std::endl;
      *ofs << "right size:\t" << d->rsize << std::endl;
      *ofs << std::endl;
    }
    return EXIT_FAILURE;
  }

  const std::vector<std::string>& rest_ = param.rest_args();
  std::vector<std::string> rest = rest_;

  if (rest.empty()) {
    rest.push_back("-");
  }

  size_t ibufsize = std::min(MAX_INPUT_BUFFER_SIZE,
                             std::max(param.get<int>
                                            ("input-buffer-size"),
                                            MIN_INPUT_BUFFER_SIZE));

  const bool partial = param.get<bool>("partial");
  if (partial) {
    ibufsize *= 8;
  }

  MeCab::scoped_array<char> ibuf_data(new char[ibufsize]);
  char *ibuf = ibuf_data.get();

  MeCab::scoped_ptr<MeCab::Tagger> tagger(model->createTagger());

  if (!tagger.get()) {
    WHAT_ERROR("cannot create tagger");
  }

  for (size_t i = 0; i < rest.size(); ++i) {
    MeCab::istream_wrapper ifs(rest[i].c_str());
    if (!*ifs) {
      WHAT_ERROR("no such file or directory: " << rest[i]);
    }

    while (true) {
      if (!partial) {
        ifs->getline(ibuf, ibufsize);
      } else {
        std::string sentence;
        MeCab::scoped_fixed_array<char, BUF_SIZE> line;
        for (;;) {
          if (!ifs->getline(line.get(), line.size())) {
            ifs->clear(std::ios::eofbit|std::ios::badbit);
            break;
          }
          sentence += line.get();
          sentence += '\n';
          if (std::strcmp(line.get(), "EOS") == 0 || line[0] == '\0') {
            break;
          }
        }
        std::strncpy(ibuf, sentence.c_str(), ibufsize);
      }
      if (ifs->eof() && !ibuf[0]) {
        return false;
      }
      if (ifs->fail()) {
        std::cerr << "input-buffer overflow. "
                  << "The line is split. use -b #SIZE option." << std::endl;
        ifs->clear();
      }
      const char *r = (nbest >= 2) ? tagger->parseNBest(nbest, ibuf) :
          tagger->parse(ibuf);
      if (!r)  {
        WHAT_ERROR(tagger->what());
      }
      *ofs << r << std::flush;
    }
  }

  return EXIT_SUCCESS;

#undef WHAT_ERROR
}